

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_string.cc
# Opt level: O3

string * Rtrim(string *s)

{
  undefined1 *local_28;
  pointer local_20;
  pointer local_18;
  
  local_20 = (s->_M_dataplus)._M_p;
  local_18 = local_20 + s->_M_string_length;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
            (&local_28,&local_18,&local_20,isspace);
  s->_M_string_length = (long)local_28 - (long)(s->_M_dataplus)._M_p;
  *local_28 = 0;
  return s;
}

Assistant:

std::string &Rtrim(std::string &s) {
    s.erase(std::find_if(s.rbegin(), s.rend(),
            std::not1(std::ptr_fun<int, int>(std::isspace))).base(), s.end());
    return s;
}